

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmSourceFileSetProperty(void *arg,char *prop,char *value)

{
  cmSourceFile *this;
  char *__s;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38 [32];
  
  this = *arg;
  if (this == (cmSourceFile *)0x0) {
    if (prop == (char *)0x0) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,prop,&local_59);
    __s = "NOTFOUND";
    if (value != (char *)0x0) {
      __s = value;
    }
    std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_5a);
    cmPropertyMap::SetProperty((cmPropertyMap *)((long)arg + 0x80),&local_58,(string *)local_38);
  }
  else {
    if (value == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,prop,(allocator<char> *)local_38);
      cmSourceFile::RemoveProperty(this,&local_58);
      goto LAB_003774ef;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,prop,&local_59);
    std::__cxx11::string::string<std::allocator<char>>(local_38,value,&local_5a);
    cmSourceFile::SetProperty(this,&local_58,(string *)local_38);
  }
  std::__cxx11::string::~string(local_38);
LAB_003774ef:
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

static void CCONV cmSourceFileSetProperty(void* arg, const char* prop,
                                          const char* value)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (cmSourceFile* rsf = sf->RealSourceFile) {
    if (!value) {
      rsf->RemoveProperty(prop);
    } else {
      rsf->SetProperty(prop, value);
    }
  } else if (prop) {
    if (!value) {
      value = "NOTFOUND";
    }
    sf->Properties.SetProperty(prop, value);
  }
}